

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManWriter.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::DataManWriter::DoPutDeferred
          (DataManWriter *this,Variable<long_double> *variable,longdouble *values)

{
  longdouble *in_stack_000001c0;
  Variable<long_double> *in_stack_000001c8;
  DataManWriter *in_stack_000001d0;
  allocator local_99;
  string local_98 [8];
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  LogMode in_stack_ffffffffffffffb0;
  allocator local_39;
  string local_38 [56];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Engine",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff90,"DataManWriter",
             (allocator *)&stack0xffffffffffffff8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"PutDeferred",&local_99);
  helper::Comm::Rank((Comm *)0xe407a6);
  helper::Log(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
              in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
              in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  PutDeferredCommon<long_double>(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  return;
}

Assistant:

void DataManWriter::DoClose(const int transportIndex)
{
    helper::Log("Engine", "DataManWriter", "Close", m_Name, 0, m_Comm.Rank(), 5, m_Verbosity,
                helper::LogMode::INFO);

    if (m_CombinedSteps < m_CombiningSteps && m_CombinedSteps > 0)
    {
        m_Serializer.AttachAttributesToLocalPack();
        const auto buffer = m_Serializer.GetLocalPack();
        if (buffer->size() > m_SerializerBufferSize)
        {
            m_SerializerBufferSize = buffer->size();
        }

        if (m_TransportMode == "reliable")
        {
            PushBufferQueue(buffer);
        }
        else if (m_TransportMode == "fast")
        {
            if (m_Threading)
            {
                PushBufferQueue(buffer);
            }
            else
            {
                m_Publisher.Send(buffer);
            }
        }
    }

    nlohmann::json endSignal;
    endSignal["FinalStep"] = static_cast<int64_t>(m_CurrentStep);
    std::string s = endSignal.dump() + '\0';
    auto cvp = std::make_shared<std::vector<char>>(s.size());
    std::memcpy(cvp->data(), s.c_str(), s.size());

    if (m_TransportMode == "reliable")
    {
        PushBufferQueue(cvp);
    }
    else if (m_TransportMode == "fast")
    {
        if (m_Threading)
        {
            while (!IsBufferQueueEmpty())
            {
            }
            for (int i = 0; i < 3; ++i)
            {
                PushBufferQueue(cvp);
                std::this_thread::sleep_for(std::chrono::milliseconds(10));
            }
        }
        else
        {
            for (int i = 0; i < 3; ++i)
            {
                m_Publisher.Send(cvp);
                std::this_thread::sleep_for(std::chrono::milliseconds(10));
            }
        }
    }

    if (m_ReplyThreadActive)
    {
        while (m_SentSteps < static_cast<size_t>(m_CurrentStep + 2))
        {
        }
        m_ReplyThreadActive = false;
    }
    if (m_ReplyThread.joinable())
    {
        m_ReplyThread.join();
    }

    m_PublishThreadActive = false;
    if (m_PublishThread.joinable())
    {
        m_PublishThread.join();
    }

    m_IsClosed = true;
}